

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::NeuralNetwork::Clear(NeuralNetwork *this)

{
  ulong uVar1;
  NetworkUpdateParameters *this_00;
  undefined8 *puVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
            (&(this->preprocessing_).super_RepeatedPtrFieldBase);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_00 = this->updateparams_, this_00 != (NetworkUpdateParameters *)0x0)) {
    NetworkUpdateParameters::~NetworkUpdateParameters(this_00);
    operator_delete(this_00,0x50);
  }
  this->updateparams_ = (NetworkUpdateParameters *)0x0;
  this->arrayinputshapemapping_ = 0;
  this->imageinputshapemapping_ = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void NeuralNetwork::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NeuralNetwork)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  layers_.Clear();
  preprocessing_.Clear();
  if (GetArenaForAllocation() == nullptr && updateparams_ != nullptr) {
    delete updateparams_;
  }
  updateparams_ = nullptr;
  ::memset(&arrayinputshapemapping_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&imageinputshapemapping_) -
      reinterpret_cast<char*>(&arrayinputshapemapping_)) + sizeof(imageinputshapemapping_));
  _internal_metadata_.Clear<std::string>();
}